

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcColumn::IfcColumn(IfcColumn *this)

{
  *(undefined ***)&(this->super_IfcBuildingElement).field_0x158 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcColumn";
  IfcBuildingElement::IfcBuildingElement
            (&this->super_IfcBuildingElement,&PTR_construction_vtable_24__00781c68);
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject
       = 0x781b38;
  *(undefined8 *)&(this->super_IfcBuildingElement).field_0x158 = 0x781c50;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       0x781b60;
  (this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x781b88;
  *(undefined8 *)
   &(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       0x781bb0;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.super_IfcProduct.field_0x100 =
       0x781bd8;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x138 = 0x781c00;
  *(undefined8 *)&(this->super_IfcBuildingElement).super_IfcElement.field_0x148 = 0x781c28;
  return;
}

Assistant:

IfcColumn() : Object("IfcColumn") {}